

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O3

bool __thiscall ON_PostEffects::operator==(ON_PostEffects *this,ON_PostEffects *other)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  ON_SimpleArray<const_ON_PostEffect_*> a1;
  ON_SimpleArray<const_ON_PostEffect_*> a2;
  ON_SimpleArray<const_ON_PostEffect_*> local_40;
  ON_SimpleArray<const_ON_PostEffect_*> local_28;
  
  bVar1 = this->_impl->_is_populated;
  if (other->_impl->_is_populated == false) {
    bVar3 = bVar1 ^ 1;
  }
  else if (bVar1 == false) {
    bVar3 = 0;
  }
  else {
    local_40._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818638;
    local_40.m_a = (ON_PostEffect **)0x0;
    local_40.m_count = 0;
    local_40.m_capacity = 0;
    (*this->_vptr_ON_PostEffects[10])();
    local_28._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818638;
    local_28.m_a = (ON_PostEffect **)0x0;
    local_28.m_count = 0;
    local_28.m_capacity = 0;
    (*other->_vptr_ON_PostEffects[10])(other);
    if (local_40.m_count == local_28.m_count) {
      if (local_40.m_count < 1) {
        bVar3 = 1;
      }
      else {
        lVar4 = 0;
        do {
          iVar2 = (*local_40.m_a[lVar4]->_vptr_ON_PostEffect[4])
                            (local_40.m_a[lVar4],local_28.m_a[lVar4]);
          if ((byte)iVar2 != 0) break;
          lVar4 = lVar4 + 1;
        } while (lVar4 < local_40.m_count);
        bVar3 = (byte)iVar2 ^ 1;
      }
    }
    else {
      bVar3 = 0;
    }
    ON_SimpleArray<const_ON_PostEffect_*>::~ON_SimpleArray(&local_28);
    ON_SimpleArray<const_ON_PostEffect_*>::~ON_SimpleArray(&local_40);
  }
  return (bool)bVar3;
}

Assistant:

bool ON_PostEffects::operator == (const ON_PostEffects& other) const
{
  // 3rd August 2023 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH3DM-158
  // The problem is that this is called during loading, but before the PEPs are loaded. This was
  // causing them to get populated too early so once they are loaded they don't actually get populated.

  // If the incoming pep list is not yet populated, they are equal if this one is also not populated
  // but not equal if this one is populated.
  if (!other._impl->_is_populated)
    return !_impl->_is_populated;

  // We don't want to populate this list if it's not yet populated. Remember, this method is const.
  if (!_impl->_is_populated)
    return false; // The incoming list is populated but this one isn't.

  // If we get here, the both lists are already populated, so we need to check if the lists are equal.
  ON_SimpleArray<const ON_PostEffect*> a1;
  GetPostEffects(a1);

  ON_SimpleArray<const ON_PostEffect*> a2;
  other.GetPostEffects(a2);

  if (a1.Count() != a2.Count())
    return false;

  for (int i = 0; i < a1.Count(); i++)
  {
    const ON_PostEffect& pep1 = *a1[i];
    const ON_PostEffect& pep2 = *a2[i];
    if (pep1 != pep2)
      return false;
  }

  return true;
}